

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * ot::commissioner::CborValue::Deserialize
                  (Error *__return_storage_ptr__,CborValue *aValue,uint8_t *aBuf,size_t aLength)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_102;
  v10 local_101;
  v10 *local_100;
  size_t local_f8;
  string local_f0;
  cn_cbor *local_d0;
  cn_cbor *cbor;
  size_t aLength_local;
  uint8_t *aBuf_local;
  CborValue *aValue_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  cbor = (cn_cbor *)aLength;
  aLength_local = (size_t)aBuf;
  aBuf_local = (uint8_t *)aValue;
  aValue_local = (CborValue *)__return_storage_ptr__;
  local_d0 = cn_cbor_decode(aBuf,aLength,(cn_cbor_errback *)0x0);
  if (local_d0 == (cn_cbor *)0x0) {
    Deserialize::anon_class_1_0_00000001::operator()(&local_102);
    local_58 = &local_100;
    local_60 = &local_101;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_f8 = bVar1.size_;
    local_100 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_78 = local_100;
    sStack_70 = local_f8;
    local_50 = &local_78;
    local_88 = local_100;
    local_80 = local_f8;
    local_68 = &local_f0;
    local_48 = local_88;
    sStack_40 = local_80;
    local_a8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = local_a8;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_f0,local_88,fmt,args);
    Error::Error(__return_storage_ptr__,kBadFormat,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    aBuf_local[8] = '\x01';
    *(cn_cbor **)(aBuf_local + 0x10) = local_d0;
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborValue::Deserialize(CborValue &aValue, const uint8_t *aBuf, size_t aLength)
{
    cn_cbor *cbor = cn_cbor_decode(aBuf, aLength, nullptr);
    if (cbor == nullptr)
    {
        return ERROR_BAD_FORMAT("deserialie CBOR value");
    }

    aValue.mIsRoot = true;
    aValue.mCbor   = cbor;
    return ERROR_NONE;
}